

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int begin_record_message(ptls_message_emitter_t *_self)

{
  ptls_buffer_t *buf;
  int iVar1;
  
  buf = _self->buf;
  _self[1].buf = (ptls_buffer_t *)buf->off;
  iVar1 = ptls_buffer_reserve(buf,5);
  if (iVar1 == 0) {
    builtin_memcpy(buf->base + buf->off,"\x16\x03\x03",4);
    buf->base[buf->off + 4] = '\0';
    buf->off = buf->off + 5;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int begin_record_message(ptls_message_emitter_t *_self)
{
    struct st_ptls_record_message_emitter_t *self = (void *)_self;
    int ret;

    self->rec_start = self->super.buf->off;
    ptls_buffer_push(self->super.buf, PTLS_CONTENT_TYPE_HANDSHAKE, PTLS_RECORD_VERSION_MAJOR, PTLS_RECORD_VERSION_MINOR, 0, 0);
    ret = 0;
Exit:
    return ret;
}